

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

bool __thiscall mpt::array::set(array *this,reference<mpt::buffer> *a)

{
  buffer *this_00;
  type_traits *ptVar1;
  buffer *b;
  reference<mpt::buffer> *a_local;
  array *this_local;
  
  this_00 = reference<mpt::buffer>::instance(a);
  if ((this_00 != (buffer *)0x0) &&
     (ptVar1 = buffer::content_traits(this_00), ptVar1 != (type_traits *)0x0)) {
    return false;
  }
  reference<mpt::array::content>::operator=(&this->_buf,(reference<mpt::array::content> *)a);
  return true;
}

Assistant:

bool array::set(const reference<buffer> &a)
{
	buffer *b;
	if ((b = a.instance()) && b->content_traits()) {
		return false;
	}
	_buf = reinterpret_cast<const reference<content> &>(a);
	return true;
}